

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

bool ExportModel(aiScene *pOut,ImportData *imp,string *path,char *pID)

{
  Exporter *this;
  clock_t __s;
  ImportData *pScene;
  aiReturn aVar1;
  char *pcVar2;
  clock_t cVar3;
  double seconds;
  clock_t second;
  allocator<char> local_61;
  string local_60;
  aiReturn local_3c;
  clock_t cStack_38;
  aiReturn res;
  clock_t first;
  char *pID_local;
  string *path_local;
  ImportData *imp_local;
  aiScene *pOut_local;
  
  first = (clock_t)pID;
  pID_local = (char *)path;
  path_local = (string *)imp;
  imp_local = (ImportData *)pOut;
  if ((imp->log & 1U) != 0) {
    SetLogStreams(imp);
  }
  printf("Launching asset export ...           OK\n");
  if ((path_local->field_0x4 & 1) != 0) {
    PrintHorBar();
  }
  cStack_38 = clock();
  pScene = imp_local;
  __s = first;
  this = globalExporter;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)__s,&local_61);
  aVar1 = Assimp::Exporter::Export
                    (this,(aiScene *)pScene,&local_60,(string *)pID_local,0,(ExportProperties *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_3c = aVar1;
  if ((path_local->field_0x4 & 1) != 0) {
    PrintHorBar();
  }
  if (local_3c == aiReturn_SUCCESS) {
    cVar3 = clock();
    printf("Exporting file ...                   OK \n   export took approx. %.5f seconds\n\n",
           (double)(cVar3 - cStack_38) / 1000000.0);
    if ((path_local[1]._M_string_length & 0x100) != 0) {
      FreeLogStreams();
    }
    pOut_local._7_1_ = true;
  }
  else {
    printf("Failed to write file\n");
    pcVar2 = Assimp::Exporter::GetErrorString(globalExporter);
    printf("ERROR: %s\n",pcVar2);
    pOut_local._7_1_ = false;
  }
  return pOut_local._7_1_;
}

Assistant:

bool ExportModel(const aiScene* pOut,  
	const ImportData& imp, 
	const std::string& path,
	const char* pID)
{
	// Attach log streams
	if (imp.log) {
		SetLogStreams(imp);
	}
	printf("Launching asset export ...           OK\n");

	if (imp.showLog) {
		PrintHorBar();
	}

	// do the actual export, measure time
	const clock_t first = clock();
	const aiReturn res = globalExporter->Export(pOut,pID,path);

	if (imp.showLog) {
		PrintHorBar();
	}
	if (res != AI_SUCCESS) {
		printf("Failed to write file\n");
		printf("ERROR: %s\n", globalExporter->GetErrorString());
		return false;
	}

	const clock_t second = ::clock();
	const double seconds = static_cast<double>(second-first) / CLOCKS_PER_SEC;

	printf("Exporting file ...                   OK \n   export took approx. %.5f seconds\n"
		"\n",seconds);

	if (imp.log) { 
		FreeLogStreams();
	}

	return true;
}